

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::unchecked_emplace_with_rehash<std::__cxx11::string_const&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          *this,size_t hash,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  arrays_type new_arrays_;
  locator local_60;
  arrays_type local_48;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(this + 0x28);
  auVar2._8_8_ = 0x41;
  auVar2._0_8_ = 0xc9714fbcda3ac11;
  fVar3 = ceilf((float)((SUB168(auVar1 * auVar2,8) >> 6) + 1) / 0.875);
  table_arrays<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::new_(&local_48,&local_60,(long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  nosize_unchecked_emplace_at<std::__cxx11::string_const&>
            (&local_60,this,&local_48,hash >> ((byte)local_48.groups_size_index & 0x3f),hash,args);
  __return_storage_ptr__->p = local_60.p;
  __return_storage_ptr__->pg = local_60.pg;
  __return_storage_ptr__->n = local_60.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_60._12_4_;
  table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,&local_48);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }